

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O3

SUNErrCode SUNHashMap_Values(SUNHashMap map,void ***values,int64_t value_size)

{
  void **ppvVar1;
  long lVar2;
  SUNStlVector_SUNHashMapKeyValue pSVar3;
  int iVar4;
  long lVar5;
  
  if (map != (SUNHashMap)0x0) {
    ppvVar1 = (void **)malloc(value_size * map->buckets->capacity);
    *values = ppvVar1;
    pSVar3 = map->buckets;
    if (0 < pSVar3->capacity) {
      lVar2 = 0;
      iVar4 = 0;
      do {
        if (pSVar3->values[lVar2] != (SUNHashMapKeyValue)0x0) {
          lVar5 = (long)iVar4;
          iVar4 = iVar4 + 1;
          (*values)[lVar5] = pSVar3->values[lVar2]->value;
          pSVar3 = map->buckets;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < pSVar3->capacity);
    }
    return 0;
  }
  return -9999;
}

Assistant:

SUNDIALS_MAYBE_UNUSED
SUNErrCode SUNHashMap_Values(SUNHashMap map, void*** values, int64_t value_size)
{
  int count = 0;

  if (!map) { return SUN_ERR_ARG_CORRUPT; }

  *values = (void**)malloc(SUNHashMap_Capacity(map) * value_size);
  if (!values) { return SUN_ERR_MALLOC_FAIL; }

  /* Copy the values into a new array */
  for (int64_t i = 0; i < SUNHashMap_Capacity(map); i++)
  {
    SUNHashMapKeyValue kvp = *SUNStlVector_SUNHashMapKeyValue_At(map->buckets, i);
    if (kvp) { (*values)[count++] = kvp->value; }
  }

  return SUN_SUCCESS;
}